

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session.cpp
# Opt level: O2

void __thiscall session::dispatch(session *this)

{
  buffer *this_00;
  uint uVar1;
  imanager *piVar2;
  int iVar3;
  int iVar4;
  ulong in_RAX;
  char *pcVar5;
  int error;
  ulong uStack_38;
  int body_len;
  
  this_00 = &this->recvbuf_;
  error = 0x4a;
  uStack_38 = in_RAX;
  while ((this->closed_ == false && (iVar3 = buffer::size(this_00), 0 < iVar3))) {
    uStack_38 = uStack_38 & 0xffffffff;
    pcVar5 = buffer::data(this_00);
    iVar3 = buffer::size(this_00);
    iVar3 = decode_head(&body_len,pcVar5,iVar3);
    if (iVar3 < 0) {
LAB_001088ad:
      on_error(this,error);
      return;
    }
    if (iVar3 == 0) break;
    if (body_len - 0x800001U < 0xff800000) {
      error = 0x5a;
      goto LAB_001088ad;
    }
    buffer::reserve(this_00,body_len + iVar3);
    iVar4 = buffer::size(this_00);
    if (iVar4 < body_len + iVar3) break;
    buffer::pop_data(this_00,iVar3);
    piVar2 = this->manager_;
    uVar1 = (this->super_iobject).netid_;
    pcVar5 = buffer::data(this_00);
    (*piVar2->_vptr_imanager[2])(piVar2,(ulong)uVar1,pcVar5,uStack_38 >> 0x20);
    buffer::pop_data(this_00,body_len);
  }
  buffer::trim_data(this_00);
  return;
}

Assistant:

void session::dispatch()
{
    while (!closed_ && recvbuf_.size() > 0)
    {
        int body_len = 0;
        int head_len = decode_head(&body_len, recvbuf_.data(), recvbuf_.size());
        if (head_len < 0)
        {
            on_error(EBADMSG);
            return;
        }

        if (head_len == 0)
        {
            break;
        }

        if (body_len <= 0 || body_len > max_buffer_size)
        {
            on_error(EMSGSIZE);
            return;
        }

        recvbuf_.reserve(head_len + body_len);
        if (recvbuf_.size() < head_len + body_len)
        {
            break;
        }

        recvbuf_.pop_data(head_len);
        manager_->on_package(netid_, recvbuf_.data(), body_len);
        recvbuf_.pop_data(body_len);
    }

    recvbuf_.trim_data();
}